

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *fadexpr)

{
  uint uVar1;
  uint uVar2;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar3;
  Fad<double> *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar11;
  Fad<double> *pFVar12;
  uint uVar13;
  ulong uVar14;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar15;
  value_type vVar16;
  
  pFVar15 = (fadexpr->fadexpr_).left_;
  pFVar11 = (pFVar15->fadexpr_).left_;
  pFVar12 = (pFVar11->fadexpr_).right_;
  uVar13 = (pFVar12->dx_).num_elts;
  uVar1 = (((((pFVar15->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 < (int)uVar13) {
    uVar1 = uVar13;
  }
  uVar2 = (((((fadexpr->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar1 <= (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar1 == uVar2) {
    if (uVar1 == 0) goto LAB_00fd30ca;
    pdVar10 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar1 == 0) {
      if (uVar2 != 0) {
        pdVar10 = (this->dx_).ptr_to_data;
        if (pdVar10 != (double *)0x0) {
          operator_delete__(pdVar10);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_00fd30ca;
    }
    if (uVar2 != 0) {
      pdVar10 = (this->dx_).ptr_to_data;
      if (pdVar10 != (double *)0x0) {
        operator_delete__(pdVar10);
        pFVar15 = (fadexpr->fadexpr_).left_;
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar1;
    uVar14 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar14 = (ulong)uVar1 << 3;
    }
    pdVar10 = (double *)operator_new__(uVar14);
    (this->dx_).ptr_to_data = pdVar10;
    pFVar11 = (pFVar15->fadexpr_).left_;
    pFVar12 = (pFVar11->fadexpr_).right_;
    uVar13 = (pFVar12->dx_).num_elts;
  }
  if (uVar13 != 0) {
    pFVar3 = (pFVar15->fadexpr_).right_;
    pFVar4 = (pFVar3->fadexpr_).right_;
    if ((pFVar4->dx_).num_elts != 0) {
      pFVar5 = (fadexpr->fadexpr_).right_;
      pFVar6 = (pFVar5->fadexpr_).right_;
      if ((pFVar6->dx_).num_elts != 0) {
        if (0 < (int)uVar1) {
          pdVar7 = (pFVar12->dx_).ptr_to_data;
          pdVar8 = (pFVar4->dx_).ptr_to_data;
          pdVar9 = (pFVar6->dx_).ptr_to_data;
          uVar14 = 0;
          do {
            pdVar10[uVar14] =
                 pdVar9[uVar14] * (pFVar5->fadexpr_).left_.constant_ +
                 pdVar8[uVar14] * (pFVar3->fadexpr_).left_.constant_ +
                 pdVar7[uVar14] * (pFVar11->fadexpr_).left_.constant_;
            uVar14 = uVar14 + 1;
          } while (uVar1 != uVar14);
        }
        goto LAB_00fd30ca;
      }
    }
  }
  if (0 < (int)uVar1) {
    uVar14 = 0;
    do {
      vVar16 = FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar14);
      pdVar10[uVar14] = vVar16;
      uVar14 = uVar14 + 1;
    } while (uVar1 != uVar14);
  }
LAB_00fd30ca:
  pFVar15 = (fadexpr->fadexpr_).left_;
  pFVar11 = (fadexpr->fadexpr_).right_;
  pFVar3 = (pFVar15->fadexpr_).left_;
  pFVar5 = (pFVar15->fadexpr_).right_;
  this->val_ = (pFVar11->fadexpr_).left_.constant_ * ((pFVar11->fadexpr_).right_)->val_ +
               (pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_ +
               (pFVar3->fadexpr_).left_.constant_ * ((pFVar3->fadexpr_).right_)->val_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}